

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void dump_screen(FILE *dumpfp)

{
  nh_drawing_info *pnVar1;
  long lVar2;
  long lVar3;
  nh_dbuf_entry *dbe;
  nh_drawing_info *di;
  char scrline [81];
  int local_18;
  int local_14;
  int y;
  int x;
  FILE *dumpfp_local;
  
  pnVar1 = nh_get_drawing_info();
  for (local_18 = 0; local_18 < 0x15; local_18 = local_18 + 1) {
    for (local_14 = 0; local_14 < 0x50; local_14 = local_14 + 1) {
      lVar2 = (long)local_18;
      lVar3 = (long)local_14;
      scrline[(long)local_14 + -8] = pnVar1->bgelements[dbuf[lVar2][lVar3].bg].ch;
      if (dbuf[lVar2][lVar3].trap != 0) {
        scrline[(long)local_14 + -8] = pnVar1->traps[dbuf[lVar2][lVar3].trap + -1].ch;
      }
      if (dbuf[lVar2][lVar3].obj != 0) {
        scrline[(long)local_14 + -8] = pnVar1->objects[dbuf[lVar2][lVar3].obj + -1].ch;
      }
      if (dbuf[lVar2][lVar3].invis == '\0') {
        if (dbuf[lVar2][lVar3].mon != 0) {
          if ((pnVar1->num_monsters < (int)dbuf[lVar2][lVar3].mon) &&
             ((dbuf[lVar2][lVar3].monflags & 8U) != 0)) {
            scrline[(long)local_14 + -8] =
                 pnVar1->warnings[(dbuf[lVar2][lVar3].mon + -1) - pnVar1->num_monsters].ch;
          }
          else {
            scrline[(long)local_14 + -8] = pnVar1->monsters[dbuf[lVar2][lVar3].mon + -1].ch;
          }
        }
      }
      else {
        scrline[(long)local_14 + -8] = pnVar1->invis->ch;
      }
    }
    scrline[0x48] = '\0';
    fprintf((FILE *)dumpfp,"%s\n",&di);
  }
  return;
}

Assistant:

void dump_screen(FILE *dumpfp)
{
    int x, y;
    char scrline[COLNO+1];
    const struct nh_drawing_info *di = nh_get_drawing_info();
    const struct nh_dbuf_entry *dbe;
    
    for (y = 0; y < ROWNO; y++) {
	for (x = 0; x < COLNO; x++) {
	    dbe = &dbuf[y][x];
	    scrline[x] = di->bgelements[dbe->bg].ch;
	    if (dbe->trap)	scrline[x] = di->traps[dbe->trap-1].ch;
	    if (dbe->obj)	scrline[x] = di->objects[dbe->obj-1].ch;
	    if (dbe->invis)	scrline[x] = di->invis[0].ch;
	    else if (dbe->mon) {
		if (dbe->mon > di->num_monsters && (dbe->monflags & MON_WARNING))
		    scrline[x] = di->warnings[dbe->mon - 1 - di->num_monsters].ch;
		else
		    scrline[x] = di->monsters[dbe->mon-1].ch;
	    }
	}
	
	scrline[COLNO] = '\0';
	fprintf(dumpfp, "%s\n", scrline);
    }
}